

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

FConfigEntry * __thiscall
FConfigFile::ReadMultiLineValue
          (FConfigFile *this,void *file,FConfigSection *section,char *key,char *endtag)

{
  char cVar1;
  int iVar2;
  size_t __n;
  undefined4 extraout_var;
  char *pcVar3;
  FConfigEntry *pFVar4;
  FConfigFile *this_00;
  FString value;
  char readbuf [256];
  undefined1 local_150 [16];
  FConfigSection *local_140;
  char local_138;
  char local_137;
  char local_136;
  FConfigFile local_135 [4];
  
  local_150._0_8_ = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_150._8_8_ = section;
  local_140 = (FConfigSection *)key;
  __n = strlen(endtag);
  do {
    this_00 = this;
    iVar2 = (*this->_vptr_FConfigFile[3])(this,&local_138,0x100,file);
    if (CONCAT44(extraout_var,iVar2) == 0) goto LAB_0035da86;
    if (((local_138 == '>') && (local_137 == '>')) && (local_136 == '>')) {
      this_00 = local_135;
      iVar2 = strncmp((char *)this_00,endtag,__n);
      if (iVar2 == 0) {
        pcVar3 = (char *)((long)&local_135[0]._vptr_FConfigFile + __n);
        while( true ) {
          cVar1 = *pcVar3;
          if ((cVar1 != '\n') && (cVar1 != '\r')) break;
          pcVar3 = pcVar3 + 1;
        }
        if (cVar1 == '\0') {
          this_00 = (FConfigFile *)local_150;
          FString::StripRight((FString *)this_00,"\n\r");
        }
LAB_0035da86:
        pFVar4 = NewConfigEntry(this_00,(FConfigSection *)local_150._8_8_,(char *)local_140,
                                (char *)local_150._0_8_);
        FString::~FString((FString *)local_150);
        return pFVar4;
      }
    }
    FString::operator+=((FString *)local_150,&local_138);
  } while( true );
}

Assistant:

FConfigFile::FConfigEntry *FConfigFile::ReadMultiLineValue(void *file, FConfigSection *section, const char *key, const char *endtag)
{
	char readbuf[READBUFFERSIZE];
	FString value;
	size_t endlen = strlen(endtag);

	// Keep on reading lines until we reach a line that matches >>>endtag
	while (ReadLine(readbuf, READBUFFERSIZE, file) != NULL)
	{
		// Does the start of this line match the endtag?
		if (readbuf[0] == '>' && readbuf[1] == '>' && readbuf[2] == '>' &&
			strncmp(readbuf + 3, endtag, endlen) == 0)
		{ // Is there nothing but line break characters after the match?
			size_t i;
			for (i = endlen + 3; readbuf[i] != '\0'; ++i)
			{
				if (readbuf[i] != '\n' && readbuf[i] != '\r')
				{ // Not a line break character
					break;
				}
			}
			if (readbuf[i] == '\0')
			{ // We're done; strip the previous line's line breaks, since it's not part of the value.
				value.StripRight("\n\r");
			}
			break;
		}
		// Append this line to the value.
		value << readbuf;
	}
	return NewConfigEntry(section, key, value);
}